

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::setCapacity
          (Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> newBuilder;
  size_t newSize_local;
  Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>>>
            ((ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)local_38,
             (kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>>>>(&this->builder);
  ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>>>::
  addAll<kj::ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>>>>
            ((ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>>> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>>>>
                     ((ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)local_38);
  ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::operator=(&this->builder,pAVar2)
  ;
  ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~ArrayBuilder
            ((ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }